

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_gnorm(double *c1,double *c2,int m,double g)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  if ((g != 0.0) || (NAN(g))) {
    dVar3 = *c1 * g + 1.0;
    if (0 < m) {
      lVar1 = (ulong)(uint)m + 1;
      do {
        c2[lVar1 + -1] = c1[lVar1 + -1] / dVar3;
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
    dVar3 = pow(dVar3,1.0 / g);
  }
  else {
    lVar1 = (long)m;
    if (c2 < c1) {
      if (m != 0) {
        lVar2 = 0;
        do {
          c2[lVar2 + 1] = c1[lVar2 + 1];
          lVar2 = lVar2 + 1;
        } while (lVar1 != lVar2);
      }
    }
    else if (m != 0) {
      do {
        c2[lVar1] = c1[lVar1];
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
    dVar3 = exp(*c1);
  }
  *c2 = dVar3;
  return;
}

Assistant:

static void HTS_gnorm(double *c1, double *c2, int m, const double g)
{
   double k;
   if (g != 0.0) {
      k = 1.0 + g * c1[0];
      for (; m >= 1; m--)
         c2[m] = c1[m] / k;
      c2[0] = pow(k, 1.0 / g);
   } else {
      HTS_movem(&c1[1], &c2[1], m);
      c2[0] = exp(c1[0]);
   }
}